

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O2

void copy_test(bool verbose)

{
  bool bVar1;
  allocator_type allocator;
  ostream *poVar2;
  string sStack_168;
  Framer framer;
  pstring astring;
  pstring string3;
  pstring string2;
  test_resource tpmr;
  
  Framer::Framer(&framer,"copy constructor test",verbose);
  std::pmr::test_resource::test_resource(&tpmr,"object",verbose);
  tpmr.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  pstring::pstring(&astring,"barfool",(allocator_type)&tpmr);
  pstring::pstring(&string2,&astring,(allocator_type)&tpmr);
  allocator.super_polymorphic_allocator<std::byte>._M_resource =
       (polymorphic_allocator<std::byte>)std::pmr::get_default_resource();
  pstring::pstring(&string3,&astring,allocator);
  pstring::str_abi_cxx11_(&sStack_168,&astring);
  bVar1 = std::operator!=(&sStack_168,"barfool");
  std::__cxx11::string::~string((string *)&sStack_168);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"astring.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&sStack_168,&astring);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sStack_168);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&sStack_168);
    errorCount = errorCount + 1;
  }
  pstring::str_abi_cxx11_(&sStack_168,&string2);
  bVar1 = std::operator!=(&sStack_168,"barfool");
  std::__cxx11::string::~string((string *)&sStack_168);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"string2.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&sStack_168,&string2);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sStack_168);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&sStack_168);
    errorCount = errorCount + 1;
  }
  pstring::str_abi_cxx11_(&sStack_168,&string3);
  bVar1 = std::operator!=(&sStack_168,"barfool");
  std::__cxx11::string::~string((string *)&sStack_168);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"string3.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&sStack_168,&string3);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sStack_168);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&sStack_168);
    errorCount = errorCount + 1;
  }
  pstring::~pstring(&string3);
  pstring::~pstring(&string2);
  pstring::~pstring(&astring);
  std::pmr::test_resource::~test_resource(&tpmr);
  Framer::~Framer(&framer);
  return;
}

Assistant:

void copy_test(bool verbose)
{
    Framer framer{ "copy constructor test", verbose };

    std::pmr::test_resource tpmr{ "object", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };
    pstring string2{ astring, &tpmr };
    pstring string3{ astring };

    ASSERT_EQ(astring.str(), "barfool");
    ASSERT_EQ(string2.str(), "barfool");
    ASSERT_EQ(string3.str(), "barfool");
}